

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.h
# Opt level: O0

void __thiscall SRCINFO::SRCINFO(SRCINFO *this,SRCINFO *other)

{
  SourceContextInfo **ppSVar1;
  SRCINFO *other_local;
  SRCINFO *this_local;
  
  ppSVar1 = Memory::WriteBarrierPtr::operator_cast_to_SourceContextInfo__((WriteBarrierPtr *)other);
  Memory::WriteBarrierPtr<SourceContextInfo>::WriteBarrierPtr(&this->sourceContextInfo,*ppSVar1);
  this->dlnHost = other->dlnHost;
  this->ulColumnHost = other->ulColumnHost;
  this->lnMinHost = other->lnMinHost;
  this->ichMinHost = other->ichMinHost;
  this->ichLimHost = other->ichLimHost;
  this->ulCharOffset = other->ulCharOffset;
  this->moduleID = other->moduleID;
  this->grfsi = other->grfsi;
  return;
}

Assistant:

SRCINFO(const SRCINFO& other)
        :sourceContextInfo(other.sourceContextInfo),
        dlnHost(other.dlnHost),
        ulColumnHost(other.ulColumnHost),
        lnMinHost(other.lnMinHost),
        ichMinHost(other.ichMinHost),
        ichLimHost(other.ichLimHost),
        ulCharOffset(other.ulCharOffset),
        moduleID(other.moduleID),
        grfsi(other.grfsi)
    {
    }